

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall
llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics,integerPart value)

{
  integerPart *piVar1;
  integerPart value_local;
  fltSemantics *ourSemantics_local;
  IEEEFloat *this_local;
  
  initialize(this,ourSemantics);
  this->field_0x12 = this->field_0x12 & 0xf7;
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  zeroSignificand(this);
  this->exponent = (short)ourSemantics->precision + -1;
  piVar1 = significandParts(this);
  *piVar1 = value;
  normalize(this,rmNearestTiesToEven,lfExactlyZero);
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics, integerPart value) {
  initialize(&ourSemantics);
  sign = 0;
  category = fcNormal;
  zeroSignificand();
  exponent = ourSemantics.precision - 1;
  significandParts()[0] = value;
  normalize(rmNearestTiesToEven, lfExactlyZero);
}